

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

cmSourceFile * __thiscall cmTarget::AddSource(cmTarget *this,string *src)

{
  bool bVar1;
  cmTargetInternals *pcVar2;
  size_type sVar3;
  undefined1 local_c8 [8];
  cmListFileBacktrace lfbt;
  TargetPropertyEntryFinder local_a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  undefined1 local_70 [8];
  cmSourceFileLocation sfl;
  string *src_local;
  cmTarget *this_local;
  
  sfl.Name.field_2._8_8_ = src;
  cmSourceFileLocation::cmSourceFileLocation((cmSourceFileLocation *)local_70,this->Makefile,src);
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  local_80._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&pcVar2->SourceEntries);
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  local_98._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&pcVar2->SourceEntries);
  TargetPropertyEntryFinder::TargetPropertyEntryFinder(&local_a0,(cmSourceFileLocation *)local_70);
  local_78 = std::
             find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,TargetPropertyEntryFinder>
                       (local_80,local_98,local_a0);
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  lfbt.Cur = (Entry *)std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end(&pcVar2->SourceEntries);
  bVar1 = __gnu_cxx::operator==
                    (&local_78,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&lfbt.Cur);
  if (bVar1) {
    cmMakefile::GetBacktrace((cmListFileBacktrace *)local_c8,this->Makefile);
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pcVar2->SourceEntries,(value_type *)sfl.Name.field_2._8_8_);
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
              (&pcVar2->SourceBacktraces,(value_type *)local_c8);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_c8);
  }
  sVar3 = cmGeneratorExpression::Find(sfl.Name.field_2._8_8_);
  if (sVar3 == 0xffffffffffffffff) {
    this_local = (cmTarget *)
                 cmMakefile::GetOrCreateSource
                           (this->Makefile,(string *)sfl.Name.field_2._8_8_,false);
  }
  else {
    this_local = (cmTarget *)0x0;
  }
  cmSourceFileLocation::~cmSourceFileLocation((cmSourceFileLocation *)local_70);
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile* cmTarget::AddSource(const std::string& src)
{
  cmSourceFileLocation sfl(this->Makefile, src);
  if (std::find_if(this->Internal->SourceEntries.begin(),
                   this->Internal->SourceEntries.end(),
                   TargetPropertyEntryFinder(sfl)) ==
      this->Internal->SourceEntries.end()) {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.push_back(src);
    this->Internal->SourceBacktraces.push_back(lfbt);
  }
  if (cmGeneratorExpression::Find(src) != std::string::npos) {
    return CM_NULLPTR;
  }
  return this->Makefile->GetOrCreateSource(src);
}